

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O2

void __thiscall
QListModel::ensureSorted(QListModel *this,int column,SortOrder order,int start,int end)

{
  QListWidgetItem **ppQVar1;
  long lVar2;
  bool bVar3;
  ulong uVar4;
  long lVar5;
  code *__comp;
  
  if (column == 0) {
    uVar4 = 1;
    if (1 < start) {
      uVar4 = (ulong)(uint)start;
    }
    ppQVar1 = (this->items).d.ptr;
    lVar2 = (this->items).d.size;
    lVar5 = (long)(end + 2);
    if (lVar2 < end + 2) {
      lVar5 = lVar2;
    }
    __comp = ensureSorted::anon_class_1_0_00000001::__invoke;
    if (order == AscendingOrder) {
      __comp = ensureSorted::anon_class_1_0_00000001::__invoke;
    }
    bVar3 = std::
            is_sorted<QList<QListWidgetItem*>::const_iterator,bool(*)(QListWidgetItem_const*,QListWidgetItem_const*)>
                      ((const_iterator)(ppQVar1 + (uVar4 - 1)),(const_iterator)(ppQVar1 + lVar5),
                       __comp);
    if (!bVar3) {
      (**(code **)(*(long *)this + 0x140))(this,0,order);
      return;
    }
  }
  return;
}

Assistant:

void QListModel::ensureSorted(int column, Qt::SortOrder order, int start, int end)
{
    if (column != 0)
        return;

    const auto compareLt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *left < *right;
    };

    const auto compareGt = [](const QListWidgetItem *left, const QListWidgetItem *right) -> bool {
        return *right < *left;
    };

    /** Check if range [start,end] is already in sorted position in list.
     *  Take for this the assumption, that outside [start,end] the list
     *  is already sorted. Therefore the sorted check has to be extended
     *  to the first element that is known to be sorted before the range
     *  [start, end], which is (start-1) and the first element after the
     *  range [start, end], which is (end+2) due to end being included.
    */
    const auto beginChangedIterator = items.constBegin() + qMax(start - 1, 0);
    const auto endChangedIterator = items.constBegin() + qMin(end + 2, items.size());
    const bool needsSorting = !std::is_sorted(beginChangedIterator, endChangedIterator,
                                              order == Qt::AscendingOrder ? compareLt : compareGt);

    if (needsSorting)
        sort(column, order);
}